

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O1

void write_handler_second_fragment(cio_websocket *websocket,void *context,cio_error err)

{
  cio_write_buffer *payload;
  _Bool _Var1;
  cio_error cVar2;
  size_t frame_length;
  
  write_handler_fake.custom_fake = write_handler_third_fragment;
  _Var1 = check_frame(CIO_WEBSOCKET_TEXT_FRAME,(char *)((long)context + 0x400),5,false);
  if (_Var1) {
    payload = (cio_write_buffer *)((long)context + 0x3c0);
    *(undefined8 *)((long)context + 0x3d0) = 0;
    *(undefined8 *)((long)context + 0x3d8) = 0;
    *(long *)((long)context + 0x3f0) = (long)context + 0x405;
    *(undefined8 *)((long)context + 0x3f8) = 5;
    *(cio_write_buffer **)((long)context + 0x3e0) = payload;
    *(cio_write_buffer **)((long)context + 1000) = payload;
    *(long *)((long)context + 0x3c0) = (long)context + 0x3e0;
    *(long *)((long)context + 0x3c8) = (long)context + 0x3e0;
    *(long *)((long)context + 0x3d0) = *(long *)((long)context + 0x3d0) + 1;
    frame_length = *(long *)((long)context + 0x3d8) + 5;
    *(size_t *)((long)context + 0x3d8) = frame_length;
    cVar2 = cio_websocket_write_message_first_chunk
                      (websocket,frame_length,payload,false,false,write_handler,context);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Writing second frame of text message did not succeed!",0xa8d,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("Written first fragment not correct",0xa86);
}

Assistant:

static void write_handler_second_fragment(struct cio_websocket *websocket, void *context, enum cio_error err)
{
	write_handler_fake.custom_fake = write_handler_third_fragment;

	struct fragmented_websocket *fws = (struct fragmented_websocket *)context;

	TEST_ASSERT_TRUE_MESSAGE(check_frame(CIO_WEBSOCKET_TEXT_FRAME, fws->first_fragment, sizeof(fws->first_fragment), false), "Written first fragment not correct");

	cio_write_buffer_head_init(&fws->wbh);
	cio_write_buffer_element_init(&fws->wb, fws->second_fragment, sizeof(fws->second_fragment));
	cio_write_buffer_queue_tail(&fws->wbh, &fws->wb);

	err = cio_websocket_write_message_first_chunk(websocket, cio_write_buffer_get_total_size(&fws->wbh), &fws->wbh, false, false, write_handler, fws);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing second frame of text message did not succeed!");
}